

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

bool __thiscall Clasp::SatPreprocessor::addClause(SatPreprocessor *this,Literal *lits,uint32 size)

{
  Clause *local_10;
  
  if (size < 2) {
    if (size != 1) {
      return false;
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (&this->units_,lits);
  }
  else {
    local_10 = Clause::newClause(lits,size);
    bk_lib::
    pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
    ::push_back(&this->clauses_,&local_10);
  }
  return true;
}

Assistant:

bool SatPreprocessor::addClause(const Literal* lits, uint32 size) {
	if (size > 1) {
		clauses_.push_back( Clause::newClause(lits, size) );
	}
	else if (size == 1) {
		units_.push_back(lits[0]);
	}
	else {
		return false;
	}
	return true;
}